

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsOpacityEffect::setOpacityMask(QGraphicsOpacityEffect *this,QBrush *mask)

{
  BrushStyle BVar1;
  QGraphicsOpacityEffectPrivate *pQVar2;
  ulong uVar3;
  QBrush *in_RSI;
  QGraphicsOpacityEffect *in_RDI;
  QGraphicsOpacityEffectPrivate *d;
  QBrush *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QGraphicsOpacityEffect *)0x4a5521);
  uVar3 = QBrush::operator==(&pQVar2->opacityMask,in_RSI);
  if ((uVar3 & 1) == 0) {
    QBrush::operator=(&pQVar2->opacityMask,in_RSI);
    BVar1 = QBrush::style((QBrush *)0x4a5564);
    pQVar2->field_0xb8 = pQVar2->field_0xb8 & 0xfb | (BVar1 != NoBrush) << 2;
    QGraphicsEffect::update(&in_RDI->super_QGraphicsEffect);
    opacityMaskChanged(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGraphicsOpacityEffect::setOpacityMask(const QBrush &mask)
{
    Q_D(QGraphicsOpacityEffect);
    if (d->opacityMask == mask)
        return;

    d->opacityMask = mask;
    d->hasOpacityMask = (mask.style() != Qt::NoBrush);
    update();

    emit opacityMaskChanged(mask);
}